

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O3

fio_str_info_s * fiobj_data_read2ch(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  size_t *psVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t sVar6;
  void *pvVar7;
  ssize_t sVar8;
  int *piVar9;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  
  if (((io == 0) || ((~(uint)io & 6) == 0 || (io & 1) != 0)) ||
     (*(char *)(io & 0xfffffffffffffff8) != '+')) {
    piVar9 = __errno_location();
    *piVar9 = 0xe;
  }
  else if (*(int *)(io + 0x30) == -2) {
    if (*(long *)(io + 0x28) != *(long *)(io + 0x20)) {
      uVar4 = *(undefined8 *)(*(long *)(io + 0x10) + 0x28);
      *(long *)(*(long *)(io + 0x10) + 0x28) = *(long *)(io + 0x28) + *(long *)(io + 0x18);
      fiobj_data_read2ch(__return_storage_ptr__,*(FIOBJ *)(io + 0x10),token);
      *(undefined8 *)(*(long *)(io + 0x10) + 0x28) = uVar4;
      uVar5 = *(ulong *)(io + 0x20);
      if (__return_storage_ptr__->len + *(long *)(io + 0x28) <= uVar5) {
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->len = uVar5 - *(long *)(io + 0x28);
      *(ulong *)(io + 0x28) = uVar5;
      return __return_storage_ptr__;
    }
  }
  else if (*(int *)(io + 0x30) == -1) {
    lVar2 = *(long *)(io + 0x20);
    sVar6 = lVar2 - *(long *)(io + 0x28);
    if (sVar6 != 0) {
      lVar3 = *(long *)(io + 8);
      pcVar13 = (char *)(*(long *)(io + 0x28) + lVar3);
      pvVar7 = memchr(pcVar13,(uint)token,sVar6);
      lVar11 = (long)pvVar7 + 1;
      if (pvVar7 == (void *)0x0) {
        lVar11 = lVar2 + lVar3;
      }
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = lVar11 - (long)pcVar13;
      __return_storage_ptr__->data = pcVar13;
      *(long *)(io + 0x28) = lVar11 - lVar3;
      return __return_storage_ptr__;
    }
  }
  else {
    lVar2 = *(long *)(io + 0x28);
    sVar6 = *(long *)(io + 0x20) - lVar2;
    if (sVar6 != 0) {
      pcVar13 = (char *)(*(long *)(io + 8) + lVar2);
      pvVar7 = memchr(pcVar13,(uint)token,sVar6);
      if (pvVar7 != (void *)0x0) {
        sVar10 = (long)pvVar7 + (1 - (long)pcVar13);
        pcVar12 = (char *)0x0;
        if (sVar10 != 0) {
          pcVar12 = pcVar13;
        }
        *(size_t *)(io + 0x28) = sVar10 + lVar2;
        *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar10;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = sVar10;
        __return_storage_ptr__->data = pcVar12;
        return __return_storage_ptr__;
      }
    }
    psVar1 = (size_t *)(io + 0x20);
    *psVar1 = 0;
    *(undefined8 *)(io + 0x28) = 0;
    while( true ) {
      fiobj_data_pre_write(io,0x1000);
      while( true ) {
        sVar8 = pread(*(int *)(io + 0x30),(void *)(*(long *)(io + 8) + *(long *)(io + 0x20)),0x1000,
                      *(long *)(io + 0x20) + *(long *)(io + 0x10));
        if (-1 < sVar8) break;
        piVar9 = __errno_location();
        if (*piVar9 != 4) goto LAB_0011c312;
      }
      sVar6 = *psVar1;
      if (sVar8 == 0) break;
      sVar6 = sVar6 + sVar8;
      *psVar1 = sVar6;
      if (sVar6 != 0) {
        pcVar13 = *(char **)(io + 8);
        pvVar7 = memchr(pcVar13,(uint)token,sVar6);
        if (pvVar7 != (void *)0x0) {
          sVar10 = (long)pvVar7 + (1 - (long)(pcVar13 + *(long *)(io + 0x28)));
          *(size_t *)(io + 0x28) = sVar10;
          *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar10;
          __return_storage_ptr__->capa = 0;
          __return_storage_ptr__->len = sVar10;
          __return_storage_ptr__->data = pcVar13;
          return __return_storage_ptr__;
        }
      }
    }
    if (sVar6 != 0) {
      *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar6;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = sVar6;
      __return_storage_ptr__->data = *(char **)(io + 8);
      return __return_storage_ptr__;
    }
  }
LAB_0011c312:
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_read2ch(FIOBJ io, uint8_t token) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_read2ch_str(io, token);
    break;
  case -2:
    return fiobj_data_read2ch_slice(io, token);
    break;
  default:
    return fiobj_data_read2ch_file(io, token);
  }
}